

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O2

void av1_svc_reset_temporal_layers(AV1_COMP *cpi,int is_key)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  iVar2 = (cpi->svc).number_spatial_layers;
  iVar3 = 0;
  if (iVar2 < 1) {
    iVar2 = iVar3;
  }
  for (; iVar3 != iVar2; iVar3 = iVar3 + 1) {
    uVar1 = (cpi->svc).number_temporal_layers;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    lVar5 = (long)(int)(uVar1 * iVar3) * 0x3380;
    while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
      if (is_key != 0) {
        *(undefined4 *)((long)&((cpi->svc).layer_context)->frames_from_key_frame + lVar5) = 0;
      }
      lVar5 = lVar5 + 0x3380;
    }
  }
  av1_update_temporal_layer_framerate(cpi);
  av1_restore_layer_context(cpi);
  return;
}

Assistant:

void av1_svc_reset_temporal_layers(AV1_COMP *const cpi, int is_key) {
  SVC *const svc = &cpi->svc;
  LAYER_CONTEXT *lc = NULL;
  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      lc = &cpi->svc.layer_context[sl * svc->number_temporal_layers + tl];
      if (is_key) lc->frames_from_key_frame = 0;
    }
  }
  av1_update_temporal_layer_framerate(cpi);
  av1_restore_layer_context(cpi);
}